

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi13.hpp
# Opt level: O0

error_code __thiscall
websocketpp::processor::hybi13<websocketpp::config::asio>::process_handshake
          (hybi13<websocketpp::config::asio> *this,request_type *request,string *subprotocol,
          response_type *response)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  string *in_RCX;
  error_code eVar4;
  error_code ec;
  string server_key;
  string *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  parser *in_stack_fffffffffffffe00;
  parser *this_00;
  parser *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe38;
  allocator *paVar5;
  hybi13<websocketpp::config::asio> *in_stack_fffffffffffffe40;
  undefined1 local_189 [40];
  allocator<char> local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [24];
  string *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  parser *in_stack_fffffffffffffef0;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [36];
  undefined4 local_9c;
  error_code local_98 [2];
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  string *local_30;
  ulong local_10;
  error_category *local_8;
  
  local_30 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Sec-WebSocket-Key",&local_71);
  psVar2 = http::parser::parser::get_header
                     (in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->m_version);
  std::__cxx11::string::string(local_50,(string *)psVar2);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  eVar4 = process_handshake_key(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_98[0]._M_cat = eVar4._M_cat;
  local_98[0]._M_value = eVar4._M_value;
  bVar1 = std::error_code::operator_cast_to_bool(local_98);
  if (bVar1) {
    local_10 = CONCAT44(local_98[0]._4_4_,local_98[0]._M_value);
    local_8 = local_98[0]._M_cat;
  }
  else {
    paVar5 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Sec-WebSocket-Accept",paVar5);
    http::parser::parser::replace_header
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Upgrade",&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffef0,"websocket",(allocator *)&stack0xfffffffffffffeef)
    ;
    http::parser::parser::append_header
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Connection",&local_139);
    this_00 = (parser *)&local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"Upgrade",(allocator *)this_00);
    http::parser::parser::append_header
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      psVar2 = (string *)local_189;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_189 + 1),"Sec-WebSocket-Protocol",(allocator *)psVar2);
      http::parser::parser::replace_header(this_00,psVar2,local_30);
      std::__cxx11::string::~string((string *)(local_189 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_189);
      in_stack_fffffffffffffdf0 = local_30;
    }
    std::error_code::error_code((error_code *)in_stack_fffffffffffffdf0);
  }
  local_9c = 1;
  std::__cxx11::string::~string(local_50);
  eVar4._0_8_ = local_10 & 0xffffffff;
  eVar4._M_cat = local_8;
  return eVar4;
}

Assistant:

lib::error_code process_handshake(request_type const & request, 
        std::string const & subprotocol, response_type & response) const
    {
        std::string server_key = request.get_header("Sec-WebSocket-Key");

        lib::error_code ec = process_handshake_key(server_key);

        if (ec) {
            return ec;
        }

        response.replace_header("Sec-WebSocket-Accept",server_key);
        response.append_header("Upgrade",constants::upgrade_token);
        response.append_header("Connection",constants::connection_token);

        if (!subprotocol.empty()) {
            response.replace_header("Sec-WebSocket-Protocol",subprotocol);
        }

        return lib::error_code();
    }